

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stochastic.hxx
# Opt level: O0

string * __thiscall
StochasticProcess::getDescription_abi_cxx11_(string *__return_storage_ptr__,StochasticProcess *this)

{
  StochasticProcess *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->stochDescription);
  return __return_storage_ptr__;
}

Assistant:

string getDescription() {
		return stochDescription;
	}